

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

bool fmt::v8::detail::check_char_specs<char,fmt::v8::detail::error_handler>
               (basic_format_specs<char> *specs,error_handler *eh)

{
  presentation_type pVar1;
  char *message;
  
  pVar1 = specs->type;
  if (pVar1 - 1 < 6) {
    return false;
  }
  if ((pVar1 == none) || (pVar1 == chr)) {
    if (((*(ushort *)&specs->field_0x9 & 0xf) != 4) && ((*(ushort *)&specs->field_0x9 & 0xf0) == 0))
    {
      return true;
    }
    message = "invalid format specifier for char";
  }
  else {
    message = "invalid type specifier";
  }
  error_handler::on_error(eh,message);
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr) {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}